

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_mu_timeout_stress_test.c
# Opt level: O1

void test_mu_timeout_stress(testing t)

{
  int iVar1;
  uintmax_t uVar2;
  nsync_time nVar3;
  nsync_time b;
  cv_stress_data local_100;
  
  nVar3 = nsync::nsync_time_now();
  b = nsync::nsync_time_ms(5000);
  nVar3 = nsync::nsync_time_add(nVar3,b);
  uVar2 = 3;
  do {
    memset(&local_100,0,0xd0);
    local_100.cv_threads_per_value = 0;
    local_100.cv_reader_threads_per_value = 0;
    local_100.mu_threads_per_value = 4;
    local_100.mu_reader_threads_per_value = 2;
    local_100.loop_count = uVar2;
    local_100.deadline = nVar3;
    iVar1 = run_stress_test(&local_100,t,"test_mu_timeout_stress");
    uVar2 = uVar2 * 2;
  } while (iVar1 == 0);
  return;
}

Assistant:

static void test_mu_timeout_stress (testing t) {
	uintmax_t loop_count = 3;
	cv_stress_data s;
	nsync_time deadline;
	deadline = nsync_time_add (nsync_time_now (), nsync_time_ms (5000));
	do {
		memset ((void *) &s, 0, sizeof (s));
		s.loop_count = loop_count;
		s.cv_threads_per_value = 0;
		s.cv_reader_threads_per_value = 0;
		s.mu_threads_per_value = 4;
		s.mu_reader_threads_per_value = 2;
		s.deadline = deadline;
		loop_count *= 2;
	} while (!run_stress_test (&s, t, "test_mu_timeout_stress"));
}